

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmNinjaTargetGenerator::GetDyndepFilePath
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,string *lang,string *config)

{
  ulong uVar1;
  cmGlobalNinjaGenerator *pcVar2;
  char local_101;
  string local_100;
  cmAlphaNum local_e0;
  string local_b0;
  cmAlphaNum local_90;
  string local_60;
  undefined1 local_29;
  string *local_28;
  string *config_local;
  string *lang_local;
  cmNinjaTargetGenerator *this_local;
  string *path;
  
  local_29 = 0;
  local_28 = config;
  config_local = lang;
  lang_local = (string *)this;
  this_local = (cmNinjaTargetGenerator *)__return_storage_ptr__;
  cmLocalNinjaGenerator::GetHomeRelativeOutputPath_abi_cxx11_
            (__return_storage_ptr__,this->LocalGenerator);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'/');
  }
  (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
    _vptr_cmLocalGenerator[0xe])
            (&local_b0,this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget);
  cmAlphaNum::cmAlphaNum(&local_90,&local_b0);
  pcVar2 = GetGlobalGenerator(this);
  (*(pcVar2->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x49])
            (&local_100,pcVar2,local_28);
  cmAlphaNum::cmAlphaNum(&local_e0,&local_100);
  local_101 = '/';
  cmStrCat<char,std::__cxx11::string,char[4]>
            (&local_60,&local_90,&local_e0,&local_101,config_local,(char (*) [4])".dd");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_b0);
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::GetDyndepFilePath(
  std::string const& lang, const std::string& config) const
{
  std::string path = this->LocalGenerator->GetHomeRelativeOutputPath();
  if (!path.empty()) {
    path += '/';
  }
  path += cmStrCat(
    this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget),
    this->GetGlobalGenerator()->ConfigDirectory(config), '/', lang, ".dd");
  return path;
}